

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *in,QHostAddress *address)

{
  int i;
  long lVar1;
  long in_FS_OFFSET;
  quint32 ipv4;
  undefined4 uStack_54;
  char16_t *pcStack_50;
  qsizetype local_48;
  qint8 prot;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  prot = -0x56;
  QDataStream::operator>>(in,&prot);
  if (prot == '\0') {
    _ipv4 = (Data *)CONCAT44(uStack_54,0xaaaaaaaa);
    QDataStream::operator>>(in,(int *)&ipv4);
    QHostAddress::setAddress(address,ipv4);
  }
  else if (prot == '\x01') {
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
      QDataStream::operator>>(in,local_38 + lVar1);
    }
    QHostAddress::setAddress(address,(Q_IPV6ADDR *)local_38);
    _ipv4 = (Data *)0x0;
    pcStack_50 = (char16_t *)0x0;
    local_48 = 0;
    operator>>(in,(QString *)&ipv4);
    QHostAddress::setScopeId(address,(QString *)&ipv4);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ipv4);
  }
  else if (prot == '\x02') {
    QHostAddress::setAddress(address,Any);
  }
  else if (prot == -1) {
    QHostAddress::clear(address);
  }
  else {
    QHostAddress::clear(address);
    QDataStream::setStatus((Status)in);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QHostAddress &address)
{
    qint8 prot;
    in >> prot;
    switch (QHostAddress::NetworkLayerProtocol(prot)) {
    case QHostAddress::UnknownNetworkLayerProtocol:
        address.clear();
        break;
    case QHostAddress::IPv4Protocol:
    {
        quint32 ipv4;
        in >> ipv4;
        address.setAddress(ipv4);
    }
        break;
    case QHostAddress::IPv6Protocol:
    {
        Q_IPV6ADDR ipv6;
        for (int i = 0; i < 16; ++i)
            in >> ipv6[i];
        address.setAddress(ipv6);

        QString scope;
        in >> scope;
        address.setScopeId(scope);
    }
        break;
    case QHostAddress::AnyIPProtocol:
        address = QHostAddress::Any;
        break;
    default:
        address.clear();
        in.setStatus(QDataStream::ReadCorruptData);
    }
    return in;
}